

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_raw_cert(ptls_verify_certificate_t *_self,ptls_t *tls,
                   _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t **verifier,
                   void **verify_data,ptls_iovec_t *certs,size_t num_certs)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RDI;
  undefined8 *in_R8;
  long in_R9;
  int r;
  ptls_iovec_t expected_pubkey;
  int ret;
  ptls_openssl_raw_pubkey_verify_certificate_t *self;
  uchar *local_50;
  long local_48;
  int local_3c;
  long local_38;
  long local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_3c = 0x2a;
  local_38 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  memset(&local_50,0,0x10);
  if (local_30 == 0) {
    __assert_fail("num_certs != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                  ,0x566,
                  "int verify_raw_cert(ptls_verify_certificate_t *, ptls_t *, int (**)(void *, uint16_t, ptls_iovec_t, ptls_iovec_t), void **, ptls_iovec_t *, size_t)"
                 );
  }
  if (local_30 == 1) {
    iVar1 = i2d_PUBKEY(*(EVP_PKEY **)(local_38 + 0x10),&local_50);
    if (iVar1 < 1) {
      local_3c = 0x2a;
    }
    else {
      local_48 = (long)iVar1;
      if ((local_28[1] == local_48) &&
         (iVar1 = (*ptls_mem_equal)(local_50,(void *)*local_28,local_28[1]), iVar1 != 0)) {
        EVP_PKEY_up_ref(*(undefined8 *)(local_38 + 0x10));
        *local_20 = *(undefined8 *)(local_38 + 0x10);
        *local_18 = verify_sign;
        local_3c = 0;
      }
    }
  }
  free(local_50);
  return local_3c;
}

Assistant:

static int verify_raw_cert(ptls_verify_certificate_t *_self, ptls_t *tls,
                           int (**verifier)(void *, uint16_t algo, ptls_iovec_t, ptls_iovec_t), void **verify_data,
                           ptls_iovec_t *certs, size_t num_certs)
{
    ptls_openssl_raw_pubkey_verify_certificate_t *self = (ptls_openssl_raw_pubkey_verify_certificate_t *)_self;
    int ret = PTLS_ALERT_BAD_CERTIFICATE;
    ptls_iovec_t expected_pubkey = {0};

    assert(num_certs != 0);

    if (num_certs != 1)
        goto Exit;

    int r = i2d_PUBKEY(self->expected_pubkey, &expected_pubkey.base);
    if (r <= 0) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }

    expected_pubkey.len = r;
    if (certs[0].len != expected_pubkey.len)
        goto Exit;

    if (!ptls_mem_equal(expected_pubkey.base, certs[0].base, certs[0].len))
        goto Exit;

    EVP_PKEY_up_ref(self->expected_pubkey);
    *verify_data = self->expected_pubkey;
    *verifier = verify_sign;
    ret = 0;
Exit:
    free(expected_pubkey.base);
    return ret;
}